

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
Add<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *this,int propertyIndex,
          WriteBarrierPtr<const_Js::PropertyRecord> *propertyKey,PropertyAttributes attributes,
          bool isInitialized,bool isFixed,bool usedAsFixed,ScriptContext *scriptContext)

{
  Type *pTVar1;
  BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
  *this_00;
  JavascriptString *pJVar2;
  code *pcVar3;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *pPVar4;
  DynamicTypeHandler *pDVar5;
  bool bVar6;
  PropertyId propertyId;
  undefined4 *puVar7;
  undefined7 in_register_00000009;
  PropertyRecord *key;
  Type *pTVar8;
  JavascriptString *local_70;
  JavascriptString *local_68;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_60;
  SimpleDictionaryPropertyDescriptor<int> local_58;
  JavascriptLibrary *local_50;
  uint local_44;
  JavascriptString *local_40;
  DynamicTypeHandler *local_38;
  
  key = propertyKey->ptr;
  if (key != (PropertyRecord *)0x0) {
    local_50 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    local_44 = (uint)CONCAT71(in_register_00000009,attributes);
    local_58.Attributes = attributes;
    local_58.propertyIndex = propertyIndex;
    local_38 = (DynamicTypeHandler *)this;
    if ((isFixed || usedAsFixed) && (((uint)key->pid < 0x10 || (*(long *)(this + 0x20) == 0)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x41c,
                                  "((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr))"
                                  ,
                                  "(!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr)"
                                 );
      if (!bVar6) goto LAB_00e327ea;
      *puVar7 = 0;
      key = propertyKey->ptr;
    }
    if (((uint)key->pid < 0x10) || (key->isSymbol == true)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x41f,"(!TMapKey_IsJavascriptString<TMapKey>())",
                                  "!TMapKey_IsJavascriptString<TMapKey>()");
      if (!bVar6) {
LAB_00e327ea:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
      *(byte *)&local_38[1].unusedBytes = (byte)local_38[1].unusedBytes | 4;
      key = propertyKey->ptr;
    }
    local_58._0_1_ = (usedAsFixed << 3 | isFixed << 2 | isInitialized * '\x02') + 1;
    this_00 = (BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
               *)local_38[1]._vptr_DynamicTypeHandler;
    local_40 = TMapKey_ConvertKey<Js::JavascriptString*>(scriptContext,key);
    JsUtil::
    BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>::InsertOperations)0>
              (this_00,&local_40,&local_58);
    pTVar1 = &local_50->typesWithNoSpecialPropertyProtoChain;
    Memory::Recycler::WBSetBit((char *)&local_60);
    local_60 = pTVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
    pPVar4 = local_60;
    pJVar2 = (JavascriptString *)propertyKey->ptr;
    Memory::Recycler::WBSetBit((char *)&local_70);
    local_70 = pJVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_70);
    pJVar2 = local_70;
    Memory::Recycler::WBSetBit((char *)&local_40);
    local_40 = pJVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
    bVar6 = NoSpecialPropertyCache::IsSpecialProperty((PropertyRecord *)local_40);
    if ((bVar6) &&
       (local_38->propertyTypes = local_38->propertyTypes | 0x80, (local_38->flags & 0x20) != 0)) {
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(pPVar4);
    }
    pTVar8 = &local_50->typesWithOnlyWritablePropertyProtoChain;
    Memory::Recycler::WBSetBit((char *)&local_60);
    local_60 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)pTVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
    pPVar4 = local_60;
    pJVar2 = (JavascriptString *)propertyKey->ptr;
    Memory::Recycler::WBSetBit((char *)&local_68);
    local_68 = pJVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
    pJVar2 = local_68;
    Memory::Recycler::WBSetBit((char *)&local_40);
    local_40 = pJVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
    pDVar5 = local_38;
    if ((local_44 & 4) == 0) {
      DynamicTypeHandler::SetHasOnlyWritableDataProperties(local_38,false);
      if ((pDVar5->flags & 0x20) != 0) {
        propertyId = DynamicTypeHandler::TMapKey_GetPropertyId
                               (scriptContext,(PropertyRecord *)local_40);
        ScriptContext::InvalidateStoreFieldCaches(scriptContext,propertyId);
        PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                  ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)pPVar4);
      }
    }
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyIndex propertyIndex,
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        //
        // For a function with same named parameters,
        // property id Constants::NoProperty will be passed for all the dups except the last one
        // We need to allocate space for dups, but don't add those to map
        if (propertyKey != NULL)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyIndex, attributes);
            Assert((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr));
            if (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext))
            {
                Assert(!TMapKey_IsJavascriptString<TMapKey>());
                hasNamelessPropertyId = true;
            }
#if ENABLE_FIXED_FIELDS
            descriptor.isInitialized = isInitialized;
            descriptor.isFixed = isFixed;
            descriptor.usedAsFixed = usedAsFixed;
#endif
            propertyMap->Add(TMapKey_ConvertKey<TMapKey>(scriptContext, propertyKey), descriptor);

            library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
            library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
        }
    }